

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

int mpc_input_string(mpc_input_t *i,char *c,char **o)

{
  char c_00;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  mpc_input_mark(i);
  c_00 = *c;
  if (c_00 != '\0') {
    pcVar3 = c + 1;
    do {
      iVar1 = mpc_input_char(i,c_00,(char **)0x0);
      if (iVar1 == 0) {
        mpc_input_rewind(i);
        return 0;
      }
      c_00 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (c_00 != '\0');
  }
  mpc_input_unmark(i);
  sVar2 = strlen(c);
  pcVar3 = (char *)mpc_malloc(i,sVar2 + 1);
  *o = pcVar3;
  strcpy(pcVar3,c);
  return 1;
}

Assistant:

static int mpc_input_string(mpc_input_t *i, const char *c, char **o) {

  const char *x = c;

  mpc_input_mark(i);
  while (*x) {
    if (!mpc_input_char(i, *x, NULL)) {
      mpc_input_rewind(i);
      return 0;
    }
    x++;
  }
  mpc_input_unmark(i);

  *o = mpc_malloc(i, strlen(c) + 1);
  strcpy(*o, c);
  return 1;
}